

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void ImGui::PopItemWidth(void)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  uint uVar3;
  float *pfVar4;
  
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  iVar1 = (pIVar2->DC).ItemWidthStack.Size;
  if (0 < iVar1) {
    uVar3 = iVar1 - 1;
    (pIVar2->DC).ItemWidthStack.Size = uVar3;
    if (uVar3 == 0) {
      pfVar4 = &pIVar2->ItemWidthDefault;
    }
    else {
      pfVar4 = (pIVar2->DC).ItemWidthStack.Data + ((ulong)uVar3 - 1);
    }
    (pIVar2->DC).ItemWidth = *pfVar4;
    return;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                ,0x5d8,"void ImVector<float>::pop_back() [T = float]");
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->WriteAccessed = true; return g.CurrentWindow; }